

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * Strsafe_find(char *key)

{
  s_x1node *psVar1;
  s_x1 *psVar2;
  int iVar3;
  char *__s1;
  s_x1node **ppsVar4;
  
  psVar2 = x1a;
  if (x1a == (s_x1 *)0x0) {
LAB_0010a86d:
    __s1 = (char *)0x0;
  }
  else {
    iVar3 = strhash(key);
    ppsVar4 = psVar2->ht + ((long)iVar3 & (long)psVar2->size - 1U);
    do {
      psVar1 = *ppsVar4;
      if (psVar1 == (s_x1node *)0x0) goto LAB_0010a86d;
      __s1 = psVar1->data;
      iVar3 = strcmp(__s1,key);
      ppsVar4 = &psVar1->next;
    } while (iVar3 != 0);
  }
  return __s1;
}

Assistant:

const char *Strsafe_find(const char *key)
{
  int h;
  x1node *np;

  if( x1a==0 ) return 0;
  h = strhash(key) & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}